

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_parameters params)

{
  ZSTD_CCtx_params cctxParams_00;
  ZSTD_parameters params_00;
  ZSTD_CCtx_params params_01;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  void *in_stack_00000020;
  undefined8 in_stack_00000028;
  void *in_stack_00000030;
  ZSTD_CCtx_params cctxParams;
  size_t in_stack_ffffffffffffff58;
  void *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff68;
  void *in_stack_ffffffffffffff70;
  ZSTD_CCtx *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  cctxParams_00.customMem.customAlloc = (ZSTD_allocFunction)in_stack_00000010;
  cctxParams_00._0_96_ = *(undefined1 (*) [96])(in_RDI + 0x28);
  cctxParams_00.customMem.customFree = (ZSTD_freeFunction)in_stack_00000018;
  cctxParams_00.customMem.opaque = in_stack_00000020;
  params_00.cParams._8_8_ = in_stack_00000030;
  params_00.cParams._0_8_ = in_stack_00000028;
  params_00.cParams._16_8_ = in_stack_ffffffffffffff58;
  params_00._24_8_ = in_stack_ffffffffffffff60;
  params_00.fParams._4_8_ = in_stack_ffffffffffffff68;
  ZSTD_assignParamsToCCtxParams(cctxParams_00,params_00);
  params_01.cParams.chainLog = (int)in_stack_ffffffffffffffa0;
  params_01.cParams.hashLog = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  params_01.format = (int)in_stack_ffffffffffffff98;
  params_01.cParams.windowLog = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  params_01.cParams.searchLog = (int)in_stack_ffffffffffffffa8;
  params_01.cParams.searchLength = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  params_01.cParams.targetLength = (int)in_stack_ffffffffffffffb0;
  params_01.cParams.strategy = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  params_01.fParams.contentSizeFlag = (int)in_stack_ffffffffffffffb8;
  params_01.fParams.checksumFlag = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  params_01.fParams.noDictIDFlag = (int)in_stack_ffffffffffffffc0;
  params_01.compressionLevel = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  params_01.disableLiteralCompression = (int)in_stack_ffffffffffffffc8;
  params_01.forceWindow = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  params_01.nbWorkers = (int)in_R9;
  params_01.jobSize = (int)((ulong)in_R9 >> 0x20);
  params_01.overlapSizeLog = (int)in_R8;
  params_01.ldmParams.enableLdm = (int)((ulong)in_R8 >> 0x20);
  params_01.ldmParams.hashLog = (int)in_RCX;
  params_01.ldmParams.bucketSizeLog = (int)((ulong)in_RCX >> 0x20);
  params_01.ldmParams.minMatchLength = (int)in_RDX;
  params_01.ldmParams.hashEveryLog = (int)((ulong)in_RDX >> 0x20);
  params_01._88_8_ = in_RSI;
  params_01.customMem.customAlloc = (ZSTD_allocFunction)in_RDI;
  params_01.customMem.opaque = (void *)in_stack_00000008;
  params_01.customMem.customFree = (ZSTD_freeFunction)unaff_retaddr;
  sVar1 = ZSTD_compress_advanced_internal
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                     in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_00000030,
                     in_stack_ffffffffffffff90,params_01);
  return sVar1;
}

Assistant:

static size_t ZSTD_compress_internal (ZSTD_CCtx* cctx,
                               void* dst, size_t dstCapacity,
                         const void* src, size_t srcSize,
                         const void* dict,size_t dictSize,
                               ZSTD_parameters params)
{
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    DEBUGLOG(4, "ZSTD_compress_internal");
    return ZSTD_compress_advanced_internal(cctx,
                                          dst, dstCapacity,
                                          src, srcSize,
                                          dict, dictSize,
                                          cctxParams);
}